

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O0

bool __thiscall draco::MetadataDecoder::DecodeEntry(MetadataDecoder *this,Metadata *metadata)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  DecoderBuffer *this_01;
  ulong __n;
  size_t *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entry_value;
  uint32_t data_size;
  string entry_name;
  uint *in_stack_ffffffffffffff48;
  string *name;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff60;
  allocator_type *__a;
  MetadataDecoder *in_stack_ffffffffffffff68;
  allocator_type local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  uint local_4c;
  undefined4 local_48;
  string local_38 [55];
  byte local_1;
  
  std::__cxx11::string::string(local_38);
  bVar1 = DecodeName(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (bVar1) {
    local_4c = 0;
    bVar1 = DecodeVarint<unsigned_int>(in_stack_ffffffffffffff48,(DecoderBuffer *)0x19aa37);
    if (bVar1) {
      if (local_4c == 0) {
        local_1 = 0;
        local_48 = 1;
      }
      else {
        __n = (ulong)local_4c;
        this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  DecoderBuffer::remaining_size((DecoderBuffer *)*in_RDI);
        if ((long)this_00 < (long)__n) {
          local_1 = 0;
          local_48 = 1;
        }
        else {
          this_01 = (DecoderBuffer *)(ulong)local_4c;
          __a = &local_69;
          std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x19aad1);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,__n,__a);
          std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x19aaf1);
          name = (string *)*in_RDI;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_68,0);
          local_1 = DecoderBuffer::Decode
                              (this_01,(void *)CONCAT17(in_stack_ffffffffffffff57,
                                                        in_stack_ffffffffffffff50),(size_t)name);
          if ((bool)local_1) {
            Metadata::AddEntryBinary
                      ((Metadata *)CONCAT17(local_1,in_stack_ffffffffffffff50),name,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x19ab8d);
          }
          local_48 = 1;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
        }
      }
    }
    else {
      local_1 = 0;
      local_48 = 1;
    }
  }
  else {
    local_1 = 0;
    local_48 = 1;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool MetadataDecoder::DecodeEntry(Metadata *metadata) {
  std::string entry_name;
  if (!DecodeName(&entry_name)) {
    return false;
  }
  uint32_t data_size = 0;
  if (!DecodeVarint(&data_size, buffer_)) {
    return false;
  }
  if (data_size == 0) {
    return false;
  }
  if (data_size > buffer_->remaining_size()) {
    return false;
  }
  std::vector<uint8_t> entry_value(data_size);
  if (!buffer_->Decode(&entry_value[0], data_size)) {
    return false;
  }
  metadata->AddEntryBinary(entry_name, entry_value);
  return true;
}